

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

void * qp_pushpop_ptr(priority_queue *qp,wchar_t priority,void *payload)

{
  priority_queue_element *ppVar1;
  undefined4 uVar2;
  priority_queue_element *ppVar3;
  void *local_28;
  void *result;
  void *payload_local;
  wchar_t priority_local;
  priority_queue *qp_local;
  
  if ((qp != (priority_queue *)0x0) && (qp->count <= qp->size)) {
    local_28 = payload;
    if ((qp->count != 0) && (qp->data->priority < priority)) {
      local_28 = (qp->data->payload).p;
      if (qp->data[qp->count - 1].priority < priority) {
        ppVar1 = qp->data;
        ppVar3 = qp->data + (qp->count - 1);
        ppVar1->payload = ppVar3->payload;
        uVar2 = *(undefined4 *)&ppVar3->field_0xc;
        ppVar1->priority = ppVar3->priority;
        *(undefined4 *)&ppVar1->field_0xc = uVar2;
        qp->data[qp->count - 1].priority = priority;
        qp->data[qp->count - 1].payload.p = payload;
      }
      else {
        qp->data->priority = priority;
        (qp->data->payload).p = payload;
      }
      down_heap(qp,0);
    }
    return local_28;
  }
  __assert_fail("qp && qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                ,0x1c5,"void *qp_pushpop_ptr(struct priority_queue *, int, void *)");
}

Assistant:

void *qp_pushpop_ptr(struct priority_queue *qp, int priority, void *payload)
{
	void *result;

	assert(qp && qp->count <= qp->size);
	if (qp->count == 0 || priority <= qp->data[0].priority) {
		result = payload;
	} else {
		result = qp->data[0].payload.p;
		if (priority <= qp->data[qp->count - 1].priority) {
			qp->data[0].priority = priority;
			qp->data[0].payload.p = payload;
		} else {
			qp->data[0] = qp->data[qp->count - 1];
			qp->data[qp->count - 1].priority = priority;
			qp->data[qp->count - 1].payload.p = payload;
		}
		down_heap(qp, 0);
	}

	return result;
}